

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
* __thiscall
nlohmann::json_abi_v3_11_3::detail::
iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
::operator--(iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
             *this)

{
  iterator *piVar1;
  primitive_iterator_t *ppVar2;
  value_t vVar3;
  
  if (this->m_object != (pointer)0x0) {
    vVar3 = (this->m_object->m_data).m_type;
    if (vVar3 == array) {
      piVar1 = &(this->m_it).array_iterator;
      piVar1->_M_current = piVar1->_M_current + -1;
    }
    else if (vVar3 == object) {
      std::
      __advance<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,long>
                (&this->m_it,0xffffffffffffffff);
    }
    else {
      ppVar2 = &(this->m_it).primitive_iterator;
      ppVar2->m_it = ppVar2->m_it + -1;
    }
    return this;
  }
  __assert_fail("m_object != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/pantor[P]inja/third_party/include/nlohmann/json.hpp"
                ,0x33f2,
                "iter_impl<BasicJsonType> &nlohmann::detail::iter_impl<const nlohmann::basic_json<>>::operator--() [BasicJsonType = const nlohmann::basic_json<>]"
               );
}

Assistant:

iter_impl& operator--()
    {
        JSON_ASSERT(m_object != nullptr);

        switch (m_object->m_data.m_type)
        {
            case value_t::object:
            {
                std::advance(m_it.object_iterator, -1);
                break;
            }

            case value_t::array:
            {
                std::advance(m_it.array_iterator, -1);
                break;
            }

            case value_t::null:
            case value_t::string:
            case value_t::boolean:
            case value_t::number_integer:
            case value_t::number_unsigned:
            case value_t::number_float:
            case value_t::binary:
            case value_t::discarded:
            default:
            {
                --m_it.primitive_iterator;
                break;
            }
        }

        return *this;
    }